

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

size_t __thiscall Memory::Recycler::BackgroundFinishMark(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  CollectionState CVar3;
  size_t sVar4;
  size_t sVar5;
  undefined8 *in_FS_OFFSET;
  size_t rescannedRootBytes;
  Recycler *this_local;
  
  if ((this->inPartialCollectMode & 1U) == 0) {
    bVar2 = DoQueueTrackedObject(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x162d,"(this->inPartialCollectMode || this->DoQueueTrackedObject())",
                         "this->inPartialCollectMode || this->DoQueueTrackedObject()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  CVar3 = ObservableValue::operator_cast_to_CollectionState
                    ((ObservableValue *)&this->collectionState);
  if (CVar3 != CollectionStateConcurrentFinishMark) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1631,"(collectionState == CollectionStateConcurrentFinishMark)",
                       "collectionState == CollectionStateConcurrentFinishMark");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  sVar4 = FinishMarkRescan(this,true);
  SetCollectionState(this,CollectionStateConcurrentFindRoots);
  sVar5 = BackgroundFindRoots(this);
  SetCollectionState(this,CollectionStateConcurrentFinishMark);
  ProcessMark(this,true);
  return sVar5 + sVar4 * 0x1000;
}

Assistant:

size_t
Recycler::BackgroundFinishMark()
{
#if ENABLE_PARTIAL_GC
    Assert(this->inPartialCollectMode || this->DoQueueTrackedObject());
#else
    Assert(this->DoQueueTrackedObject());
#endif
    Assert(collectionState == CollectionStateConcurrentFinishMark);
    size_t rescannedRootBytes = FinishMarkRescan(true) * AutoSystemInfo::PageSize;
    this->SetCollectionState(CollectionStateConcurrentFindRoots);
    rescannedRootBytes += this->BackgroundFindRoots();
    this->SetCollectionState(CollectionStateConcurrentFinishMark);
    RECYCLER_PROFILE_EXEC_BACKGROUND_BEGIN(this, Js::MarkPhase);
    ProcessMark(true);
    RECYCLER_PROFILE_EXEC_BACKGROUND_END(this, Js::MarkPhase);
    return rescannedRootBytes;
}